

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdump.h
# Opt level: O0

void hexdump(char *desc,void *addr,size_t len,FILE *fp)

{
  uchar *pc;
  uchar buf [17];
  uint local_2c;
  uint i;
  FILE *fp_local;
  size_t len_local;
  void *addr_local;
  char *desc_local;
  
  if (desc != (char *)0x0) {
    fprintf((FILE *)fp,"%s:\n",desc);
  }
  for (local_2c = 0; local_2c < (uint)len; local_2c = local_2c + 1) {
    if ((local_2c & 0xf) == 0) {
      if (local_2c != 0) {
        fprintf((FILE *)fp,"  |%s|\n",&pc);
      }
      fprintf((FILE *)fp,"%08x ",(ulong)local_2c);
    }
    else if ((local_2c & 7) == 0) {
      fprintf((FILE *)fp," ");
    }
    fprintf((FILE *)fp," %02x",(ulong)*(byte *)((long)addr + (ulong)local_2c));
    if ((*(byte *)((long)addr + (ulong)local_2c) < 0x20) ||
       (0x7e < *(byte *)((long)addr + (ulong)local_2c))) {
      buf[(ulong)(local_2c & 0xf) - 8] = '.';
    }
    else {
      buf[(ulong)(local_2c & 0xf) - 8] = *(uchar *)((long)addr + (ulong)local_2c);
    }
    buf[(ulong)((local_2c & 0xf) + 1) - 8] = '\0';
  }
  if (((local_2c & 0xf) < 9) && ((local_2c & 0xf) != 0)) {
    fprintf((FILE *)fp," ");
  }
  for (; (local_2c & 0xf) != 0; local_2c = local_2c + 1) {
    fprintf((FILE *)fp,"   ");
  }
  fprintf((FILE *)fp,"  |%s|\n",&pc);
  return;
}

Assistant:

static void hexdump(const char *desc, const void *addr, size_t len, FILE *fp) {
    unsigned int i;
    unsigned char buf[17];
    const unsigned char *pc = (const unsigned char*)addr;

    /* Output description if given. */
    if (desc != NULL) fprintf(fp, "%s:\n", desc);

    for (i = 0; i < (unsigned int)len; i++) {

        if ((i % 16) == 0) {
            if (i != 0) fprintf(fp, "  |%s|\n", buf);
            fprintf(fp, "%08x ", i);
        } else if ((i % 8) == 0) {
            fprintf(fp, " ");
        }
        fprintf(fp, " %02x", pc[i]);
        if ((pc[i] < 0x20) || (pc[i] > 0x7e)) {
            buf[i % 16] = '.';
        } else {
            buf[i % 16] = pc[i];
        }
        buf[(i % 16) + 1] = '\0';
    }
    if (i % 16 <= 8 && i % 16 != 0) fprintf(fp, " ");
    while ((i % 16) != 0) {
        fprintf(fp, "   ");
        i++;
    }
    fprintf(fp, "  |%s|\n", buf);
}